

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

void __thiscall duckdb::DBConfig::SetDefaultTempDirectory(DBConfig *this)

{
  char *__s1;
  int iVar1;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  if ((this->options).use_temporary_directory == false) {
    local_38 = 0;
    local_30[0] = 0;
    local_40 = local_30;
    ::std::__cxx11::string::operator=
              ((string *)&(this->options).temporary_directory,(string *)&local_40);
    if (local_40 == local_30) {
      return;
    }
  }
  else {
    __s1 = (this->options).database_path._M_dataplus._M_p;
    if (((__s1 == (char *)0x0) || (*__s1 == '\0')) || (iVar1 = strcmp(__s1,":memory:"), iVar1 == 0))
    {
      ::std::__cxx11::string::_M_replace
                ((ulong)&(this->options).temporary_directory,0,
                 (char *)(this->options).temporary_directory._M_string_length,0x1357e11);
      return;
    }
    local_40 = local_30;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,__s1,__s1 + (this->options).database_path._M_string_length);
    ::std::__cxx11::string::append((char *)&local_40);
    ::std::__cxx11::string::operator=
              ((string *)&(this->options).temporary_directory,(string *)&local_40);
    if (local_40 == local_30) {
      return;
    }
  }
  operator_delete(local_40);
  return;
}

Assistant:

void DBConfig::SetDefaultTempDirectory() {
	if (!options.use_temporary_directory) {
		options.temporary_directory = string();
	} else if (DBConfig::IsInMemoryDatabase(options.database_path.c_str())) {
		options.temporary_directory = ".tmp";
	} else {
		options.temporary_directory = options.database_path + ".tmp";
	}
}